

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O1

void __thiscall Sampling_Normal_Test::TestBody(Sampling_Normal_Test *this)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float *pfVar5;
  size_t sVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  Allocator AVar10;
  byte bVar11;
  int iVar12;
  char *pcVar13;
  char *in_R9;
  uint64_t oldstate;
  undefined1 *puVar14;
  undefined1 auVar15 [16];
  undefined1 auVar18 [16];
  float fVar16;
  float fVar17;
  undefined1 auVar19 [64];
  Float FVar20;
  undefined1 auVar21 [16];
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM6_Qb;
  span<const_float> f;
  Float sigma;
  Float mu;
  AssertionResult gtest_ar_;
  Float dp;
  AssertionResult gtest_ar;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> values;
  PiecewiseConstant1D distrib;
  AssertHelper local_140;
  float local_138;
  Float local_134;
  float local_130;
  float local_12c;
  long *local_128;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  float local_114;
  Float local_110;
  float local_10c;
  string local_108;
  float local_e8;
  float local_e4;
  float local_e0;
  float local_dc;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_d8;
  _Any_data local_b8;
  code *pcStack_a8;
  code *pcStack_a0;
  undefined1 *local_98;
  long local_90;
  AssertHelper local_88;
  PiecewiseConstant1D local_80;
  undefined1 extraout_var [60];
  
  local_90 = 0;
  local_98 = &DAT_5851f42d4c957f2e;
  do {
    local_12c = *(float *)((long)&DAT_005d6640 + local_90);
    local_130 = *(float *)((long)&DAT_005d6644 + local_90);
    local_b8._M_unused._M_object = &local_130;
    local_b8._8_8_ = &local_12c;
    pcStack_a0 = std::
                 _Function_handler<float_(float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp:877:23)>
                 ::_M_invoke;
    pcStack_a8 = std::
                 _Function_handler<float_(float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp:877:23)>
                 ::_M_manager;
    auVar15 = vfmadd231ss_fma(ZEXT416((uint)local_12c),ZEXT416((uint)local_130),ZEXT416(0xc0e00000))
    ;
    auVar3 = vfmadd231ss_fma(ZEXT416((uint)local_12c),ZEXT416((uint)local_130),ZEXT416(0x40e00000));
    local_134 = auVar3._0_4_;
    AVar10.memoryResource = pstd::pmr::new_delete_resource();
    pbrt::Sample1DFunction
              (&local_d8,(function<float_(float)> *)&local_b8,0x2000,0x10,auVar15._0_4_,local_134,
               AVar10);
    if (pcStack_a8 != (code *)0x0) {
      (*pcStack_a8)(&local_b8,&local_b8,__destroy_functor);
    }
    sVar6 = local_d8.nStored;
    pfVar5 = local_d8.ptr;
    auVar15 = vfmadd231ss_fma(ZEXT416((uint)local_12c),ZEXT416((uint)local_130),ZEXT416(0xc0e00000))
    ;
    auVar3 = vfmadd231ss_fma(ZEXT416((uint)local_12c),ZEXT416((uint)local_130),ZEXT416(0x40e00000));
    local_134 = auVar3._0_4_;
    AVar10.memoryResource = pstd::pmr::new_delete_resource();
    f.n = sVar6;
    f.ptr = pfVar5;
    pbrt::PiecewiseConstant1D::PiecewiseConstant1D(&local_80,f,auVar15._0_4_,local_134,AVar10);
    iVar12 = 100;
    puVar14 = local_98;
    do {
      fVar17 = local_12c;
      uVar8 = (uint)((ulong)puVar14 >> 0x2d) ^ (uint)((ulong)puVar14 >> 0x1b);
      bVar11 = (byte)((ulong)puVar14 >> 0x3b);
      auVar15._8_8_ = in_XMM6_Qb;
      auVar15._0_8_ = in_XMM6_Qa;
      auVar15 = vcvtusi2ss_avx512f(auVar15,uVar8 >> bVar11 | uVar8 << 0x20 - bVar11);
      local_dc = auVar15._0_4_ * 2.3283064e-10;
      auVar15 = vminss_avx(ZEXT416((uint)local_dc),ZEXT416(0x3f7fffff));
      local_114 = local_130;
      local_134 = auVar15._0_4_;
      auVar15 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),auVar15,ZEXT416(0xbf800000));
      local_138 = auVar15._0_4_;
      auVar15 = vfnmadd213ss_fma(auVar15,auVar15,ZEXT416(0x3f800000));
      auVar15 = vmaxss_avx(SUB6416(ZEXT464(0x800000),0),auVar15);
      auVar19._0_4_ = logf(auVar15._0_4_);
      auVar19._4_60_ = extraout_var;
      if (0x7f7fffff < (uint)ABS(auVar19._0_4_)) {
        pbrt::LogFatal<char_const(&)[28]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math.h"
                   ,0x2e5,"Check failed: %s",(char (*) [28])"!IsNaN(t) && !std::isinf(t)");
      }
      auVar3._8_4_ = 0x7fffffff;
      auVar3._0_8_ = 0x7fffffff7fffffff;
      auVar3._12_4_ = 0x7fffffff;
      auVar18 = auVar19._0_16_;
      auVar15 = vandps_avx512vl(auVar18,auVar3);
      if (auVar15._0_4_ <= 6.125) {
        auVar15 = vfmadd213ss_fma(SUB6416(ZEXT464(0x31bae000),0),auVar18,ZEXT416(0x3419da2c));
        auVar15 = vfmadd213ss_fma(auVar15,auVar18,ZEXT416(0x35a4c94e));
        auVar15 = vfmadd213ss_fma(auVar15,auVar18,ZEXT416(0x33f295dd));
        auVar15 = vfmadd213ss_fma(auVar15,auVar18,ZEXT416(0xb86b8609));
        auVar15 = vfmadd213ss_fma(auVar15,auVar18,ZEXT416(0xb91adf4d));
        auVar15 = vfmadd213ss_fma(auVar15,auVar18,ZEXT416(0x3b17b201));
        auVar15 = vfmadd213ss_fma(auVar15,auVar18,ZEXT416(0x3c3d0f26));
        auVar15 = vfmadd213ss_fma(auVar15,auVar18,ZEXT416(0xbe6d9577));
        auVar15 = vfmadd213ss_fma(auVar15,auVar18,ZEXT416(0x3f62dfc4));
        FVar20 = auVar15._0_4_;
      }
      else {
        auVar15 = vfmadd213ss_fma(SUB6416(ZEXT464(0x2fa6f5a2),0),auVar18,ZEXT416(0x32fbe4d7));
        auVar15 = vfmadd213ss_fma(auVar15,auVar18,ZEXT416(0x35a3f289));
        auVar15 = vfmadd213ss_fma(auVar15,auVar18,ZEXT416(0x37ee53ef));
        auVar15 = vfmadd213ss_fma(auVar15,auVar18,ZEXT416(0x39ce55c9));
        auVar15 = vfmadd213ss_fma(auVar15,auVar18,ZEXT416(0x3b46606f));
        auVar15 = vfmadd213ss_fma(auVar15,auVar18,ZEXT416(0x3b9e5490));
        auVar15 = vfmadd213ss_fma(auVar15,auVar18,ZEXT416(0xbe877fb3));
        auVar15 = vfmadd213ss_fma(auVar15,auVar18,ZEXT416(0x3f570b52));
        FVar20 = auVar15._0_4_;
      }
      fVar16 = local_114 * 1.4142135;
      fVar2 = local_130 * local_130 * 6.2831855;
      if (fVar2 < 0.0) {
        local_e0 = local_130;
        local_e4 = local_12c;
        local_110 = FVar20;
        local_e8 = fVar16;
        local_114 = sqrtf(fVar2);
        fVar1 = local_e0;
        fVar2 = local_e4;
        fVar16 = local_e8;
        FVar20 = local_110;
      }
      else {
        auVar15 = vsqrtss_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2));
        local_114 = auVar15._0_4_;
        fVar1 = local_130;
        fVar2 = local_12c;
      }
      auVar15 = vfmadd213ss_fma(ZEXT416((uint)(FVar20 * local_138)),ZEXT416((uint)fVar16),
                                ZEXT416((uint)fVar17));
      fVar16 = auVar15._0_4_;
      fVar17 = (((fVar16 - fVar2) * (fVar16 - fVar2)) / (fVar1 * (fVar1 + fVar1))) * -1.442695;
      auVar15 = vroundss_avx(ZEXT416((uint)fVar17),ZEXT416((uint)fVar17),9);
      iVar9 = (int)auVar15._0_4_;
      local_138 = 0.0;
      if ((-0x1f < iVar9) && (local_138 = INFINITY, iVar9 < 0x1f)) {
        fVar17 = fVar17 - auVar15._0_4_;
        auVar15 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3da1d5b6),0),ZEXT416((uint)fVar17),
                                  ZEXT416(0x3e658299));
        auVar15 = vfmadd213ss_fma(auVar15,ZEXT416((uint)fVar17),ZEXT416(0x3f3263b7));
        auVar15 = vfmadd213ss_fma(auVar15,ZEXT416((uint)fVar17),ZEXT416(0x3f7ff3bf));
        local_138 = (float)(iVar9 * 0x800000 + auVar15._0_4_);
      }
      local_110 = pbrt::PiecewiseConstant1D::Sample(&local_80,local_134,&local_10c,(int *)0x0);
      auVar18._8_4_ = 0x7fffffff;
      auVar18._0_8_ = 0x7fffffff7fffffff;
      auVar18._12_4_ = 0x7fffffff;
      auVar15 = vandps_avx512vl(ZEXT416((uint)(fVar16 - local_110)),auVar18);
      local_140.data_._0_4_ = (float)auVar15._0_4_;
      local_128 = (long *)&DAT_3f689374bc6a7efa;
      testing::internal::CmpHelperLT<float,double>
                ((internal *)&local_108,"std::abs(cx - dx)","3e-3",(float *)&local_140,
                 (double *)&local_128);
      if ((char)local_108._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_128);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_128 + 2),"Closed form = ",0xe);
        std::ostream::_M_insert<double>((double)fVar16);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_128 + 2),", distrib = ",0xc);
        std::ostream::_M_insert<double>((double)local_110);
        pcVar13 = "";
        if ((undefined8 *)local_108._M_string_length != (undefined8 *)0x0) {
          pcVar13 = *(char **)local_108._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_140,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                   ,0x37a,pcVar13);
        testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_128);
        testing::internal::AssertHelper::~AssertHelper(&local_140);
        if (local_128 != (long *)0x0) {
          bVar7 = testing::internal::IsTrue(true);
          if ((bVar7) && (local_128 != (long *)0x0)) {
            (**(code **)(*local_128 + 8))();
          }
          local_128 = (long *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_108._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_138 = (1.0 / local_114) * local_138;
      auVar4._8_4_ = 0x7fffffff;
      auVar4._0_8_ = 0x7fffffff7fffffff;
      auVar4._12_4_ = 0x7fffffff;
      auVar15 = vandps_avx512vl(ZEXT416((uint)(local_138 - local_10c)),auVar4);
      local_140.data_._0_4_ = auVar15._0_4_ / local_10c;
      local_128 = (long *)&DAT_3f9999999999999a;
      testing::internal::CmpHelperLT<float,double>
                ((internal *)&local_108,"std::abs(cp - dp) / dp",".025",(float *)&local_140,
                 (double *)&local_128);
      if ((char)local_108._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_128);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_128 + 2),"Closed form PDF = ",0x12);
        std::ostream::_M_insert<double>((double)local_138);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_128 + 2),", distrib PDF = ",0x10);
        std::ostream::_M_insert<double>((double)local_10c);
        pcVar13 = "";
        if ((undefined8 *)local_108._M_string_length != (undefined8 *)0x0) {
          pcVar13 = *(char **)local_108._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_140,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                   ,0x37c,pcVar13);
        testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_128);
        testing::internal::AssertHelper::~AssertHelper(&local_140);
        if (local_128 != (long *)0x0) {
          bVar7 = testing::internal::IsTrue(true);
          if ((bVar7) && (local_128 != (long *)0x0)) {
            (**(code **)(*local_128 + 8))();
          }
          local_128 = (long *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_108._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      fVar17 = erff((fVar16 - local_12c) / (local_130 * 1.4142135));
      fVar17 = (fVar17 + 1.0) * 0.5;
      auVar3 = vminss_avx(ZEXT416((uint)local_dc),ZEXT416(0x3f7fffff));
      auVar21._8_4_ = 0x7fffffff;
      auVar21._0_8_ = 0x7fffffff7fffffff;
      auVar21._12_4_ = 0x7fffffff;
      auVar15 = vandps_avx(ZEXT416((uint)fVar17),auVar21);
      auVar15 = vminss_avx(auVar15,auVar3);
      bVar7 = auVar15._0_4_ < 0.01;
      fVar2 = local_134 - fVar17;
      auVar15 = vandps_avx(ZEXT416((uint)bVar7 * (int)fVar2 +
                                   (uint)!bVar7 * (int)((fVar2 + fVar2) / (local_134 + fVar17))),
                           auVar21);
      local_128 = (long *)CONCAT71(local_128._1_7_,auVar15._0_4_ <= 0.01);
      local_120.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (0.01 < auVar15._0_4_) {
        testing::Message::Message((Message *)&local_140);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_140.data_)->line," u ",3);
        std::ostream::_M_insert<double>((double)local_134);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_140.data_)->line," -> x = ",8);
        std::ostream::_M_insert<double>((double)fVar16);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_140.data_)->line," -> ",4);
        fVar17 = erff((fVar16 - local_12c) / (local_130 * 1.4142135));
        std::ostream::_M_insert<double>((double)((fVar17 + 1.0) * 0.5));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_140.data_)->line," with mu ",9);
        std::ostream::_M_insert<double>((double)local_12c);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_140.data_)->line," and sigma ",0xb);
        std::ostream::_M_insert<double>((double)local_130);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_108,(internal *)&local_128,
                   (AssertionResult *)"checkErr(u, InvertNormalSample(cx, mu, sigma))","true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                   ,0x387,(char *)CONCAT71(local_108._M_dataplus._M_p._1_7_,
                                           (char)local_108._M_dataplus._M_p));
        testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_140);
        testing::internal::AssertHelper::~AssertHelper(&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_108._M_dataplus._M_p._1_7_,(char)local_108._M_dataplus._M_p) !=
            &local_108.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_108._M_dataplus._M_p._1_7_,(char)local_108._M_dataplus._M_p
                                  ),local_108.field_2._M_allocated_capacity + 1);
        }
        if (local_140.data_ != (AssertHelperData *)0x0) {
          bVar7 = testing::internal::IsTrue(true);
          if ((bVar7) && (local_140.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_140.data_ + 8))();
          }
          local_140.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_120,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      puVar14 = (undefined1 *)((long)puVar14 * 0x5851f42d4c957f2d + 1);
      iVar12 = iVar12 + -1;
    } while (iVar12 != 0);
    local_80.cdf.nStored = 0;
    (*(local_80.cdf.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_80.cdf.alloc.memoryResource,local_80.cdf.ptr,local_80.cdf.nAlloc << 2,4);
    local_80.func.nStored = 0;
    (*(local_80.func.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_80.func.alloc.memoryResource,local_80.func.ptr,local_80.func.nAlloc << 2,4);
    local_d8.nStored = 0;
    (*(local_d8.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_d8.alloc.memoryResource,local_d8.ptr,local_d8.nAlloc << 2,4);
    local_90 = local_90 + 8;
  } while (local_90 != 0x20);
  return;
}

Assistant:

TEST(Sampling, Normal) {
    Float params[][2] = {{0., 1.}, {-.5, .8}, {.25, .005}, {3.6, 1.6}};
    for (const auto p : params) {
        Float mu = p[0], sigma = p[1];
        auto normal = [&](Float x) {
            return 1 / std::sqrt(2 * Pi * sigma * sigma) *
                   std::exp(-Sqr(x - mu) / (2 * sigma * sigma));
        };
        auto values = Sample1DFunction(normal, 8192, 16, mu - 7 * sigma, mu + 7 * sigma);
        PiecewiseConstant1D distrib(values, mu - 7 * sigma, mu + 7 * sigma);

        for (Float u : Uniform1D(100)) {
            Float cx = SampleNormal(u, mu, sigma);
            Float cp = NormalPDF(cx, mu, sigma);

            Float dp;
            Float dx = distrib.Sample(u, &dp);
            EXPECT_LT(std::abs(cx - dx), 3e-3)
                << "Closed form = " << cx << ", distrib = " << dx;
            EXPECT_LT(std::abs(cp - dp) / dp, .025)
                << "Closed form PDF = " << cp << ", distrib PDF = " << dp;

            auto checkErr = [](Float a, Float b) {
                Float err;
                if (std::min(std::abs(a), std::abs(b)) < 1e-2)
                    err = std::abs(a - b);
                else
                    err = std::abs(2 * (a - b) / (a + b));
                return err > 1e-2;
            };
            EXPECT_FALSE(checkErr(u, InvertNormalSample(cx, mu, sigma)))
                << " u " << u << " -> x = " << cx << " -> "
                << InvertNormalSample(cx, mu, sigma) << " with mu " << mu << " and sigma "
                << sigma;
        }
    }
}